

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belakang.h
# Opt level: O0

void __thiscall Belakang::Belakang(Belakang *this)

{
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Belakang *local_10;
  Belakang *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,0.0,0.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,0.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,800.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,800.0,0.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Belakang() {
    addPoint(Point<double>(0,0));
    addPoint(Point<double>(0,600));
    addPoint(Point<double>(800,600));
    addPoint(Point<double>(800,0));
  }